

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void push_val(VARR_char *repr,mir_long val)

{
  long lVar1;
  mir_long bound;
  long lVar2;
  
  for (lVar2 = 10; lVar2 <= val; lVar2 = lVar2 * 10) {
  }
  while (lVar2 != 1) {
    lVar2 = lVar2 / 10;
    lVar1 = val / lVar2;
    val = val % lVar2;
    VARR_charpush(repr,(char)lVar1 + '0');
  }
  return;
}

Assistant:

static void push_val (VARR (char) * repr, mir_long val) {
  mir_long bound;

  for (bound = 10; val >= bound;) bound *= 10;
  while (bound != 1) {
    bound /= 10;
    VARR_PUSH (char, repr, '0' + val / bound);
    val %= bound;
  }
}